

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void * Node_AddData(node *Node,dataid Id,datatype Type,void *Data)

{
  undefined8 *puVar1;
  size_t __n;
  nodedata *pnVar2;
  nodedata *__dest;
  
  if (((Node == (node *)0x0) ||
      (__n = Node_DataSize(Node,Id,(ulong)((uint)Type & 0x3f),Data,0x2a), __n == 0)) ||
     (puVar1 = *(undefined8 **)(*Node->VMT + 0x80),
     pnVar2 = (nodedata *)(*(code *)*puVar1)(puVar1,__n + 0x10), pnVar2 == (nodedata *)0x0)) {
    return (void *)0x0;
  }
  __dest = pnVar2 + 1;
  memcpy(__dest,Data,__n);
  pnVar2->Code = Id << 8 | Type;
  pnVar2->Next = Node->Data;
  Node->Data = pnVar2;
  if (Type != 0x17) {
    return __dest;
  }
  if (__dest->Next == (nodedata *)0x0) {
    return __dest;
  }
  Node_AddRef(__dest->Next);
  return __dest;
}

Assistant:

NOINLINE void* Node_AddData(node* Node, dataid Id, datatype Type, const void* Data)
{
    if (Node)
    {
        size_t Size = Node_DataSize(Node,Id,Type&TYPE_MASK,Data,META_PARAM_UNSET); // META_PARAM_UNSET is neutral for the type
        if (Size>0)
        {
            nodedata* Ptr;
            nodecontext* p = Node_Context(Node);

            Ptr = (nodedata*)MemHeap_Alloc(p->NodeHeap,sizeof(nodedata)+Size);
            if (!Ptr)
            {
                return NULL;
            }

            // Data list order is important. Evaluating TYPE_EXPRSTRING needs to be done in the order it was added
            // This function reverses the order, but we also use Node_Copy with templates so the final order it correct (hackish...)

            memcpy(NodeData_Data(Ptr),Data,Size);
            Ptr->Code = (Id<<DYNDATA_SHIFT)|Type;
            Ptr->Next = Node->Data;
            Node->Data = Ptr;

            if (Type == TYPE_NODE_REF && *(node**)NodeData_Data(Ptr))
                Node_AddRef(*(node**)NodeData_Data(Ptr));

            return NodeData_Data(Ptr);
        }
    }
    return NULL;
}